

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void mouse_handling::onMouseMove(GLFWwindow *window,double x,double y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  int windowH;
  int windowW;
  int local_40;
  int local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  double local_10;
  double local_8;
  
  uStack_24 = (uint)((ulong)x >> 0x20);
  if ((pressed != '\0') || (middlePressed == '\x01')) {
    local_28 = (float)x - prevX;
    fVar1 = (float)y - prevY;
    uStack_20 = in_XMM0_Dc;
    uStack_1c = in_XMM0_Dd;
    local_10 = x;
    local_8 = y;
    glfwGetWindowSize(window,&local_3c,&local_40);
    if (pressed == '\x01') {
      for (orbitCam.heading = (local_28 * -3.1415927) / (float)local_3c + orbitCam.heading;
          orbitCam.heading < 0.0; orbitCam.heading = orbitCam.heading + 6.2831855) {
      }
      for (; 6.2831855 < orbitCam.heading; orbitCam.heading = orbitCam.heading + -6.2831855) {
      }
      fVar2 = (fVar1 * -3.1415927) / (float)local_40 + orbitCam.pitch;
      fVar3 = -1.4137167;
      if (-1.4137167 <= fVar2) {
        fVar3 = fVar2;
      }
      orbitCam.pitch = 1.4137167;
      if (fVar3 <= 1.4137167) {
        orbitCam.pitch = fVar3;
      }
    }
    y = local_8;
    x = local_10;
    if (middlePressed == '\x01') {
      uStack_24 = uStack_24 ^ 0x80000000;
      uStack_20 = uStack_20 ^ 0x80000000;
      uStack_1c = uStack_1c ^ 0x80000000;
      local_2c = orbitCam.distance;
      local_28 = -local_28 / (float)local_3c;
      local_30 = cosf(orbitCam.pitch);
      local_34 = sinf(orbitCam.pitch);
      local_38 = cosf(orbitCam.heading);
      fVar3 = sinf(orbitCam.heading);
      local_28 = local_28 * local_2c;
      fVar1 = (fVar1 / (float)local_40) * local_2c;
      local_2c = local_2c * 0.0;
      orbitCam.center.field_0.x =
           fVar3 * local_2c + local_38 * local_28 + fVar1 * 0.0 + orbitCam.center.field_0.x;
      orbitCam.center.field_1.y =
           ((local_34 * fVar3 * local_28 + local_30 * fVar1) - local_38 * local_34 * local_2c) +
           orbitCam.center.field_1.y;
      orbitCam.center.field_2.z =
           local_2c * local_30 * local_38 + (fVar1 * local_34 - local_28 * local_30 * fVar3) +
           orbitCam.center.field_2.z;
      y = local_8;
      x = local_10;
    }
  }
  prevX = (float)x;
  prevY = (float)y;
  return;
}

Assistant:

void onMouseMove(GLFWwindow* window, double x, double y)
    {
        if(selectedCamera == -1) // orbit camera is active
        if(pressed || middlePressed)
        {
            const float dx = (float)x - prevX;
            const float dy = (float)y - prevY;
            int windowW, windowH;
            glfwGetWindowSize(window, &windowW, &windowH);
            if(pressed)
            {
                constexpr float speed = PI;
                orbitCam.heading -= speed * dx / windowW;
                while(orbitCam.heading < 0)
                    orbitCam.heading += 2*PI;
                while(orbitCam.heading > 2*PI)
                    orbitCam.heading -= 2*PI;
                orbitCam.pitch -= speed * dy / windowH;
                orbitCam.pitch = glm::clamp(orbitCam.pitch, -0.45f*PI, +0.45f*PI);
            }
            if(middlePressed)
            {
                // center panning
                float speed = orbitCam.distance;
                const vec3 v2d = {-dx/windowW, dy/windowH, 0};
                const glm::mat3 rot = glm::eulerAngleXY(orbitCam.pitch, orbitCam.heading);
                orbitCam.center += rot * (speed * v2d);
            }
        }
        prevX = (float)x;
        prevY = (float)y;
    }